

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniforms
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          programInfo *program_info)

{
  uint uVar1;
  int iVar2;
  GLuint n_uniforms;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  GLuint GVar6;
  uint uVar7;
  GLint buffer_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uniform_buffer_data;
  uniformDetails uniform_details;
  GLuint in_stack_ffffffffffffff78;
  GLint local_74;
  long local_70;
  GPUShaderFP64Test2 *local_68;
  GLuint local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uniformDetails local_3c;
  
  local_68 = (GPUShaderFP64Test2 *)CONCAT44(local_68._4_4_,shader_stage);
  local_74 = 0;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_70 = CONCAT44(extraout_var,iVar2);
  uVar1 = uniform_type->m_n_rows;
  uVar7 = uniform_type->m_n_columns * uVar1;
  GVar6 = program_info->m_program_object_id;
  n_uniforms = getAmountUniforms(this,(shaderStage)local_68,uniform_type);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = this;
  local_5c = GVar6;
  inspectProgram(this,GVar6,n_uniforms,uniform_type,&local_74,&local_3c,in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_58,(long)local_74);
  if (0 < (int)n_uniforms) {
    GVar6 = 0;
    iVar2 = 1;
    do {
      if (uVar7 != 0) {
        uVar5 = 0;
        do {
          *(double *)
           (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start +
           ((int)(uVar5 / uVar1) * local_3c.m_matrix_stride +
            GVar6 * local_3c.m_array_stride + local_3c.m_offset + (int)(uVar5 % (ulong)uVar1) * 8))
               = (double)(uint)(iVar2 + (int)uVar5);
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
        } while (uVar7 != uVar4);
        iVar2 = iVar2 + uVar4;
      }
      GVar6 = GVar6 + 1;
    } while (GVar6 != n_uniforms);
  }
  (**(code **)(local_70 + 0x40))(0x8a11,local_68->m_uniform_buffer_id);
  dVar3 = (**(code **)(local_70 + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1053);
  (**(code **)(local_70 + 0x150))
            (0x8a11,(long)local_74,
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar3 = (**(code **)(local_70 + 0x800))();
  glu::checkError(dVar3,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1056);
  (**(code **)(local_70 + 0x50))(0x8a11,0,local_68->m_uniform_buffer_id,0,(long)local_74);
  dVar3 = (**(code **)(local_70 + 0x800))();
  glu::checkError(dVar3,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x105a);
  (**(code **)(local_70 + 0x15d0))(local_5c,0,0);
  dVar3 = (**(code **)(local_70 + 0x800))();
  glu::checkError(dVar3,"UniformBlockBinding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x105d);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniforms(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
										 const Utils::programInfo& program_info) const
{
	glw::GLint				  buffer_size	 = 0;
	glw::GLuint				  element_ordinal = 1;
	const glw::Functions&	 gl			  = m_context.getRenderContext().getFunctions();
	const glw::GLuint		  n_columns		  = uniform_type.m_n_columns;
	const glw::GLuint		  n_rows		  = uniform_type.m_n_rows;
	const glw::GLuint		  n_elements	  = n_columns * n_rows;
	uniformDetails			  uniform_details;
	const glw::GLuint		  program_id = program_info.m_program_object_id;
	const glw::GLint		  n_uniforms = getAmountUniforms(shader_stage, uniform_type);
	std::vector<glw::GLubyte> uniform_buffer_data;
	glw::GLuint				  uniform_block_index = 0;

	/* Get uniform details */
	inspectProgram(program_id, n_uniforms, uniform_type, buffer_size, uniform_details, uniform_block_index);

	/* Uniform offset and strides */
	const glw::GLuint array_stride   = uniform_details.m_array_stride;
	const glw::GLuint matrix_stride  = uniform_details.m_matrix_stride;
	const glw::GLuint uniform_offset = uniform_details.m_offset;

	/* Prepare storage for buffer data */
	uniform_buffer_data.resize(buffer_size);

	/* Prepare uniform data */
	for (glw::GLint i = 0; i < n_uniforms; ++i)
	{
		const glw::GLuint array_entry_offset = uniform_offset + i * array_stride;

		for (glw::GLuint element = 0; element < n_elements; ++element, ++element_ordinal)
		{
			const glw::GLuint   column		 = element / n_rows;
			const glw::GLuint   column_elem  = element % n_rows;
			const glw::GLdouble value		 = element_ordinal;
			const glw::GLuint   value_offset = static_cast<glw::GLuint>(array_entry_offset + column * matrix_stride +
																	  column_elem * sizeof(glw::GLdouble));
			glw::GLdouble* value_dst = (glw::GLdouble*)&uniform_buffer_data[value_offset];

			*value_dst = value;
		}
	}

	/* Update uniform buffer with new set of data */
	gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_UNIFORM_BUFFER, buffer_size, &uniform_buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Bind uniform block to uniform buffer */
	gl.bindBufferRange(GL_UNIFORM_BUFFER, 0 /* index */, m_uniform_buffer_id, 0 /* offset */, buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	gl.uniformBlockBinding(program_id, uniform_block_index, 0 /* binding */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");
}